

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

HeapType __thiscall wasm::WasmBinaryBuilder::getIndexedHeapType(WasmBinaryBuilder *this)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  uint local_1c;
  WasmBinaryBuilder *pWStack_18;
  uint32_t index;
  WasmBinaryBuilder *this_local;
  
  pWStack_18 = this;
  local_1c = getU32LEB(this);
  uVar1 = (ulong)local_1c;
  sVar2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size(&this->types);
  if (sVar2 <= uVar1) {
    std::__cxx11::to_string(&local_60,local_1c);
    std::operator+(&local_40,"invalid heap type index: ",&local_60);
    throwError(this,&local_40);
  }
  pvVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                     (&this->types,(ulong)local_1c);
  return (HeapType)pvVar3->id;
}

Assistant:

HeapType WasmBinaryBuilder::getIndexedHeapType() {
  auto index = getU32LEB();
  if (index >= types.size()) {
    throwError("invalid heap type index: " + std::to_string(index));
  }
  return types[index];
}